

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::EventFunctionChecker::visit(EventFunctionChecker *this,Processor *p)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  string *psVar4;
  Function *pFVar5;
  bool bVar6;
  int iVar7;
  undefined4 extraout_var;
  Identifier *pIVar9;
  EndpointDetails *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  pointer ppVar10;
  long *extraout_RDX;
  Identifier *extraout_RDX_00;
  Identifier *args;
  pool_ref<soul::AST::EndpointDeclaration> *e;
  pool_ref<soul::AST::VariableDeclaration> *v;
  pointer ppVar11;
  pointer ppVar12;
  pointer ppVar13;
  pointer ppVar14;
  Type eventType;
  Type indexType;
  DuplicateNameChecker duplicateNameChecker;
  vector<soul::Type,_std::allocator<soul::Type>_> types;
  ArrayView<soul::Type> local_1e0;
  RefCountedPtr<soul::Structure> local_1d0;
  undefined1 local_1c8 [32];
  Identifier *local_1a8;
  Type local_1a0;
  DuplicateNameChecker local_188;
  ArrayView<soul::Type> local_168;
  undefined1 local_158 [8];
  pointer local_150;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  long *plVar8;
  undefined4 extraout_var_00;
  
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  local_188.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = (*(p->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[8])(p);
  for (plVar8 = (long *)CONCAT44(extraout_var,iVar7); plVar8 != extraout_RDX; plVar8 = plVar8 + 1) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_188,*(string **)(*plVar8 + 0x30),(Context *)(*plVar8 + 0x10));
  }
  ppVar1 = (p->stateVariables).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar11 = (p->stateVariables).
                 super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar1; ppVar11 = ppVar11 + 1
      ) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_188,(ppVar11->object->name).name,
               &(ppVar11->object->super_Statement).super_ASTObject.context);
  }
  ppVar2 = (p->super_ProcessorBase).super_ModuleBase.structures.
           super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar12 = (p->super_ProcessorBase).super_ModuleBase.structures.
                 super__Vector_base<soul::pool_ref<soul::AST::StructDeclaration>,_std::allocator<soul::pool_ref<soul::AST::StructDeclaration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar12 != ppVar2; ppVar12 = ppVar12 + 1
      ) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_188,(ppVar12->object->super_TypeDeclarationBase).name.name,
               &(ppVar12->object->super_TypeDeclarationBase).super_Expression.super_Statement.
                super_ASTObject.context);
  }
  ppVar3 = (p->super_ProcessorBase).super_ModuleBase.usings.
           super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar13 = (p->super_ProcessorBase).super_ModuleBase.usings.
                 super__Vector_base<soul::pool_ref<soul::AST::UsingDeclaration>,_std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar13 != ppVar3; ppVar13 = ppVar13 + 1
      ) {
    soul::DuplicateNameChecker::check<soul::AST::Context&>
              (&local_188,(ppVar13->object->super_TypeDeclarationBase).name.name,
               &(ppVar13->object->super_TypeDeclarationBase).super_Expression.super_Statement.
                super_ASTObject.context);
  }
  ppVar14 = (p->functions).
            super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar10 = (p->functions).
            super__Vector_base<soul::pool_ref<soul::AST::Function>,_std::allocator<soul::pool_ref<soul::AST::Function>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_150 = ppVar10;
  do {
    if (ppVar14 == ppVar10) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_188.names);
      return;
    }
    if (ppVar14->object->eventFunction == true) {
      iVar7 = (*(p->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[8])();
      bVar6 = false;
      args = extraout_RDX_00;
      local_1a8 = extraout_RDX_00;
      for (pIVar9 = (Identifier *)CONCAT44(extraout_var_00,iVar7); pIVar9 != args;
          pIVar9 = pIVar9 + 1) {
        psVar4 = pIVar9->name;
        if (((char)psVar4[1]._M_string_length == '\x01') &&
           ((string *)psVar4[1].field_2._M_allocated_capacity == (ppVar14->object->name).name)) {
          this_00 = pool_ptr<soul::AST::EndpointDetails>::operator*
                              ((pool_ptr<soul::AST::EndpointDetails> *)
                               ((long)&psVar4[1].field_2 + 8));
          pFVar5 = ppVar14->object;
          ppVar11 = (pFVar5->parameters).
                    super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)(pFVar5->parameters).
                          super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar11);
          if ((this_00->arraySize).object == (Expression *)0x0) {
            if (args_1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8)
            goto LAB_0023d995;
            AST::VariableDeclaration::getType((Type *)&local_1e0,ppVar11->object);
            Type::removeConstIfPresent((Type *)local_1c8,(Type *)&local_1e0);
            Type::removeReferenceIfPresent(&local_1a0,(Type *)local_1c8);
            RefCountedPtr<soul::Structure>::~RefCountedPtr
                      ((RefCountedPtr<soul::Structure> *)(local_1c8 + 0x10));
            RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_1d0);
            AST::EndpointDetails::getResolvedDataTypes
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_1e0,this_00);
            bVar6 = Type::isPresentIn(&local_1a0,local_1e0);
            if (!bVar6) {
              pFVar5 = ppVar14->object;
              Type::getDescription_abi_cxx11_((string *)local_1c8,&local_1a0);
              Errors::eventFunctionInvalidType<soul::Identifier&,std::__cxx11::string>
                        (&local_68,(Errors *)&pFVar5->name,(Identifier *)local_1c8,args_1);
              AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_68,false);
            }
            std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_1e0);
          }
          else {
            if (args_1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x10)
            {
LAB_0023d995:
              Errors::eventFunctionInvalidArguments<>();
              AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_110,false);
            }
            AST::VariableDeclaration::getType((Type *)&local_1e0,ppVar11->object);
            Type::removeConstIfPresent((Type *)local_1c8,(Type *)&local_1e0);
            Type::removeReferenceIfPresent(&local_1a0,(Type *)local_1c8);
            RefCountedPtr<soul::Structure>::~RefCountedPtr
                      ((RefCountedPtr<soul::Structure> *)(local_1c8 + 0x10));
            RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_1d0);
            AST::VariableDeclaration::getType
                      ((Type *)&local_168,
                       (ppVar14->object->parameters).
                       super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].object);
            Type::removeConstIfPresent((Type *)local_1c8,(Type *)&local_168);
            Type::removeReferenceIfPresent((Type *)&local_1e0,(Type *)local_1c8);
            RefCountedPtr<soul::Structure>::~RefCountedPtr
                      ((RefCountedPtr<soul::Structure> *)(local_1c8 + 0x10));
            RefCountedPtr<soul::Structure>::~RefCountedPtr
                      ((RefCountedPtr<soul::Structure> *)local_158);
            AST::EndpointDetails::getResolvedDataTypes
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_168,this_00);
            if (1 < local_1a0.primitiveType.type - int32) {
              pFVar5 = ppVar14->object;
              Errors::eventFunctionIndexInvalid<>();
              AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_a0,false);
            }
            bVar6 = Type::isPresentIn((Type *)&local_1e0,local_168);
            if (!bVar6) {
              pFVar5 = ppVar14->object;
              Type::getDescription_abi_cxx11_((string *)local_1c8,(Type *)&local_1e0);
              Errors::eventFunctionInvalidType<soul::Identifier&,std::__cxx11::string>
                        (&local_d8,(Errors *)&pFVar5->name,(Identifier *)local_1c8,args_1);
              AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_d8,false);
            }
            std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector
                      ((vector<soul::Type,_std::allocator<soul::Type>_> *)&local_168);
            RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_1d0);
          }
          RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_1a0.structure);
          bVar6 = true;
          args = local_1a8;
        }
      }
      ppVar10 = local_150;
      if (!bVar6) {
        pFVar5 = ppVar14->object;
        Errors::noSuchInputEvent<soul::Identifier&>(&local_148,(Errors *)&pFVar5->name,args);
        AST::Context::throwError(&(pFVar5->super_ASTObject).context,&local_148,false);
      }
    }
    ppVar14 = ppVar14 + 1;
  } while( true );
}

Assistant:

void visit (AST::Processor& p) override
        {
            super::visit (p);

            soul::DuplicateNameChecker duplicateNameChecker;

            for (auto& e : p.getEndpoints())   duplicateNameChecker.check (e->name, e->context);
            for (auto& v : p.stateVariables)   duplicateNameChecker.check (v->name, v->context);
            for (auto& s : p.structures)       duplicateNameChecker.check (s->name, s->context);
            for (auto& u : p.usings)           duplicateNameChecker.check (u->name, u->context);

            // (functions must be scanned last)
            for (auto& f : p.functions)
            {
                if (f->isEventFunction())
                {
                    bool nameFound = false;

                    for (auto& e : p.getEndpoints())
                    {
                        if (e->isInput && e->name == f->name)
                        {
                            nameFound = true;
                            const auto& details = e->getDetails();

                            if (details.arraySize == nullptr && f->parameters.size() == 1)
                            {
                                auto eventType = f->parameters.front()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto types = details.getResolvedDataTypes();

                                if (! eventType.isPresentIn (types))
                                    f->context.throwError (Errors::eventFunctionInvalidType (f->name, eventType.getDescription()));
                            }
                            else if (details.arraySize != nullptr && f->parameters.size() == 2)
                            {
                                auto indexType = f->parameters.front()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto eventType = f->parameters.back()->getType().removeConstIfPresent().removeReferenceIfPresent();
                                auto types = details.getResolvedDataTypes();

                                if (! indexType.isInteger())
                                    f->context.throwError (Errors::eventFunctionIndexInvalid());

                               if (! eventType.isPresentIn (types))
                                   f->context.throwError (Errors::eventFunctionInvalidType (f->name, eventType.getDescription()));
                            }
                            else
                            {
                                f->context.throwError (Errors::eventFunctionInvalidArguments());
                            }
                        }
                   }

                    if (! nameFound)
                        f->context.throwError (Errors::noSuchInputEvent (f->name));
                }
            }
        }